

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonBlobEdit(JsonParse *pParse,u32 iDel,u32 nDel,u8 *aIns,u32 nIns)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  if (nIns != nDel) {
    lVar4 = (ulong)nIns - (ulong)nDel;
    uVar1 = pParse->nBlob;
    lVar2 = (ulong)uVar1 + lVar4;
    if ((long)(ulong)pParse->nBlobAlloc < lVar2) {
      jsonBlobExpand(pParse,(u32)lVar2);
      if (pParse->oom != '\0') {
        return;
      }
      uVar1 = pParse->nBlob;
    }
    memmove(pParse->aBlob + (iDel + nIns),pParse->aBlob + (nDel + iDel),
            (ulong)(uVar1 - (nDel + iDel)));
    iVar3 = (int)lVar4;
    pParse->nBlob = pParse->nBlob + iVar3;
    pParse->delta = pParse->delta + iVar3;
  }
  if (aIns == (u8 *)0x0 || nIns == 0) {
    return;
  }
  memcpy(pParse->aBlob + iDel,aIns,(ulong)nIns);
  return;
}

Assistant:

static void jsonBlobEdit(
  JsonParse *pParse,     /* The JSONB to be modified is in pParse->aBlob */
  u32 iDel,              /* First byte to be removed */
  u32 nDel,              /* Number of bytes to remove */
  const u8 *aIns,        /* Content to insert */
  u32 nIns               /* Bytes of content to insert */
){
  i64 d = (i64)nIns - (i64)nDel;
  if( d!=0 ){
    if( pParse->nBlob + d > pParse->nBlobAlloc ){
      jsonBlobExpand(pParse, pParse->nBlob+d);
      if( pParse->oom ) return;
    }
    memmove(&pParse->aBlob[iDel+nIns],
            &pParse->aBlob[iDel+nDel],
            pParse->nBlob - (iDel+nDel));
    pParse->nBlob += d;
    pParse->delta += d;
  }
  if( nIns && aIns ) memcpy(&pParse->aBlob[iDel], aIns, nIns);
}